

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O3

void __thiscall
hiberlite::AVisitor<hiberlite::ExtractModel>::pushAndSubTable
          (AVisitor<hiberlite::ExtractModel> *this,string *name)

{
  Scope *__x;
  long *plVar1;
  long *plVar2;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  __x = &this->scope;
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::push_back(&(this->stack).c,__x);
  Scope::full_abi_cxx11_(&local_48,__x);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_78 = *plVar2;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar2;
    local_88 = (long *)*plVar1;
  }
  local_80 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_88,(ulong)(name->_M_dataplus)._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_58 = *plVar2;
    lStack_50 = plVar1[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar2;
    local_68 = (long *)*plVar1;
  }
  local_60 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)__x,(string *)&local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->scope)._prefix,0,(char *)(this->scope)._prefix._M_string_length,0x1790dd
            );
  (this->scope).prefix_depth = 0;
  return;
}

Assistant:

void AVisitor<C>::pushAndSubTable(std::string name)
{
	stack.push(scope);
	scope._table=scope.full()+"_"+name;
	scope._prefix="";
	scope.prefix_depth=0;
}